

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void pstd::swap<pbrt::Image>(Image *a,Image *b)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  int iVar3;
  int iVar4;
  PixelFormat PVar5;
  int iVar6;
  undefined1 local_b8 [32];
  uintptr_t uStack_98;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> vStack_90;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_70;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_50;
  
  iVar3 = (a->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  PVar5 = a->format;
  iVar6 = (a->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_b8._0_8_ = (a->channelNames).alloc.memoryResource;
  local_b8._8_8_ = (a->channelNames).ptr;
  auVar1 = *(undefined1 (*) [32])&(a->channelNames).nAlloc;
  (a->channelNames).nStored = 0;
  (a->channelNames).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (a->channelNames).nAlloc = 0;
  auVar2._0_8_ = a->encoding;
  auVar2._8_8_ = (a->p8).alloc;
  auVar2._16_8_ = (a->p8).ptr;
  auVar2._24_8_ = (a->p8).nAlloc;
  unique0x0011ec00 = vperm2i128_avx2(auVar1,auVar2,0x20);
  vStack_90.nAlloc = (a->p8).nAlloc;
  vStack_90.nStored = (a->p8).nStored;
  vStack_90.ptr = (a->p8).ptr;
  (a->p8).nStored = 0;
  (a->p8).ptr = (uchar *)0x0;
  (a->p8).nAlloc = 0;
  local_70.alloc.memoryResource = (a->p16).alloc.memoryResource;
  local_70.nAlloc = (a->p16).nAlloc;
  local_70.nStored = (a->p16).nStored;
  local_70.ptr = (a->p16).ptr;
  (a->p16).nStored = 0;
  (a->p16).ptr = (Half *)0x0;
  (a->p16).nAlloc = 0;
  local_50.alloc.memoryResource = (a->p32).alloc.memoryResource;
  local_50.nAlloc = (a->p32).nAlloc;
  local_50.nStored = (a->p32).nStored;
  local_50.ptr = (a->p32).ptr;
  (a->p32).nStored = 0;
  (a->p32).ptr = (float *)0x0;
  (a->p32).nAlloc = 0;
  iVar4 = (b->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  a->format = b->format;
  (a->resolution).super_Tuple2<pbrt::Point2,_int>.x = iVar4;
  (a->resolution).super_Tuple2<pbrt::Point2,_int>.y =
       (b->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&a->channelNames,&b->channelNames);
  (a->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (b->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=(&a->p8,&b->p8);
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=(&a->p16,&b->p16);
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(&a->p32,&b->p32);
  (b->resolution).super_Tuple2<pbrt::Point2,_int>.y = iVar3;
  b->format = PVar5;
  (b->resolution).super_Tuple2<pbrt::Point2,_int>.x = iVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&b->channelNames,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  (b->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = uStack_98;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            (&b->p8,&vStack_90);
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=(&b->p16,&local_70);
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(&b->p32,&local_50);
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_50);
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_70);
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(&vStack_90);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  return;
}

Assistant:

PBRT_CPU_GPU inline void swap(T &a, T &b) {
    T tmp = std::move(a);
    a = std::move(b);
    b = std::move(tmp);
}